

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

State __thiscall QAccessibleWidget::state(QAccessibleWidget *this)

{
  bool bVar1;
  FocusPolicy FVar2;
  Int IVar3;
  QWidget *this_00;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *in_stack_00000008;
  QWidget *w;
  State state;
  QSize *in_stack_ffffffffffffffb8;
  QWidget *this_01;
  QWidget *in_stack_ffffffffffffffd8;
  QFlagsStorageHelper<Qt::WindowType,_4> local_14;
  State local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (State)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QAccessible::State::State((State *)0x7de72b);
  this_00 = widget((QAccessibleWidget *)0x7de735);
  bVar1 = QWidget::testAttribute(this_00,(WidgetAttribute)((ulong)in_RDI >> 0x20));
  if (!bVar1) {
    local_10 = (State)((ulong)local_10 & 0xfffffffffffdffff | 0x20000);
  }
  FVar2 = QWidget::focusPolicy(this_00);
  if (FVar2 != NoFocus) {
    local_10 = (State)((ulong)local_10 & 0xfffffffffffffffb | 4);
  }
  bVar1 = QWidget::hasFocus(in_stack_ffffffffffffffd8);
  if (bVar1) {
    local_10 = (State)((ulong)local_10 & 0xfffffffffffffff7 | 8);
  }
  bVar1 = QWidget::isEnabled((QWidget *)0x7de7aa);
  if (!bVar1) {
    local_10 = (State)((ulong)local_10 & 0xfffffffffffffffe | 1);
  }
  bVar1 = QWidget::isWindow(in_RDI);
  if (bVar1) {
    QWidget::windowFlags(in_RDI);
    local_14.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)in_RDI,
                    (WindowType)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar3 != 0) {
      local_10 = (State)((ulong)local_10 & 0xffffffffffefffff | 0x100000);
    }
    QWidget::minimumSize(this_01);
    QWidget::maximumSize(this_01);
    bVar1 = ::operator!=((QSize *)in_RDI,in_stack_ffffffffffffffb8);
    if (bVar1) {
      local_10 = (State)((ulong)local_10 & 0xfffffffffff7ffff | 0x80000);
    }
    bVar1 = QWidget::isActiveWindow(in_stack_00000008);
    if (bVar1) {
      local_10 = (State)((ulong)local_10 & 0xffffffffbfffffff | 0x40000000);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QAccessible::State QAccessibleWidget::state() const
{
    QAccessible::State state;

    QWidget *w = widget();
    if (w->testAttribute(Qt::WA_WState_Visible) == false)
        state.invisible = true;
    if (w->focusPolicy() != Qt::NoFocus)
        state.focusable = true;
    if (w->hasFocus())
        state.focused = true;
    if (!w->isEnabled())
        state.disabled = true;
    if (w->isWindow()) {
        if (w->windowFlags() & Qt::WindowSystemMenuHint)
            state.movable = true;
        if (w->minimumSize() != w->maximumSize())
            state.sizeable = true;
        if (w->isActiveWindow())
            state.active = true;
    }

    return state;
}